

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

uint __thiscall
Js::ScriptContext::SaveSourceNoCopy
          (ScriptContext *this,Utf8SourceInfo *sourceInfo,int cchLength,bool isCesu8)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *this_00;
  RecyclerWeakReference<Js::Utf8SourceInfo> *local_38;
  RecyclerWeakReference<Js::Utf8SourceInfo> *sourceWeakRef;
  AutoCriticalSection autocs;
  
  if ((sourceInfo->m_scriptContext).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xadf,"(sourceInfo->GetScriptContext() == this)",
                                "sourceInfo->GetScriptContext() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = IsScriptContextInDebugMode(this);
  if ((bVar2) && ((sourceInfo->field_0xa8 & 4) == 0)) {
    bVar2 = Utf8SourceInfo::IsInDebugMode(sourceInfo);
    if (!bVar2) {
      Utf8SourceInfo::SetInDebugMode(sourceInfo,true);
    }
  }
  local_38 = Memory::Recycler::CreateWeakReferenceHandle<Js::Utf8SourceInfo>
                       (this->recycler,sourceInfo);
  sourceInfo->field_0xa8 = sourceInfo->field_0xa8 & 0xfd | isCesu8 * '\x02';
  sourceWeakRef = (RecyclerWeakReference<Js::Utf8SourceInfo> *)&this->threadContext->csFunctionBody;
  CCLock::Enter((CCLock *)sourceWeakRef);
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->sourceList);
  uVar3 = JsUtil::
          List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
          ::SetAtFirstFreeSpot(this_00,&local_38);
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&sourceWeakRef);
  return uVar3;
}

Assistant:

uint ScriptContext::SaveSourceNoCopy(Utf8SourceInfo* sourceInfo, int cchLength, bool isCesu8)
    {
        Assert(sourceInfo->GetScriptContext() == this);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsScriptContextInDebugMode() && !sourceInfo->GetIsLibraryCode() && !sourceInfo->IsInDebugMode())
        {
            sourceInfo->SetInDebugMode(true);
        }
#endif

        RecyclerWeakReference<Utf8SourceInfo>* sourceWeakRef = this->GetRecycler()->CreateWeakReferenceHandle<Utf8SourceInfo>(sourceInfo);
        sourceInfo->SetIsCesu8(isCesu8);
        {
            // We can be compiling new source code while rundown thread is reading from the list, causing AV on the reader thread
            // lock the list during write as well.
            AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());
            return sourceList->SetAtFirstFreeSpot(sourceWeakRef);
        }
    }